

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O1

void __thiscall Shell::EqualityProxy::apply(EqualityProxy *this,Problem *prb)

{
  bool bVar1;
  
  bVar1 = Kernel::Problem::hasEquality(prb);
  apply(this,&prb->_units);
  Kernel::Problem::invalidateByRemoval(prb);
  prb->_propertyValid = false;
  (prb->_hasEquality)._value = False;
  prb->_mayHaveEquality = false;
  prb->_mayHaveFunctionDefinitions = false;
  prb->_mayHaveInequalityResolvableWithDeletion = false;
  prb->_mayHaveXEqualsY = false;
  if ((bVar1) && (this->_opt < RSTC)) {
    prb->_hadIncompleteTransformation = true;
  }
  return;
}

Assistant:

void EqualityProxy::apply(Problem& prb)
{
  bool hadEquality = prb.hasEquality();

  apply(prb.units());
  prb.invalidateByRemoval();
  prb.reportEqualityEliminated();

  if (hadEquality) {
    switch(_opt) {
      case Options::EqualityProxy::R:
      case Options::EqualityProxy::RS:
      case Options::EqualityProxy::RST:
        prb.reportIncompleteTransformation();
        break;
      default:
        break;
    }
  }
}